

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaFreeFacet(xmlSchemaFacetPtr facet)

{
  xmlSchemaAnnotPtr pxVar1;
  _xmlSchemaAnnot *p_Var2;
  _xmlSchemaAnnot *p_Var3;
  
  if (facet == (xmlSchemaFacetPtr)0x0) {
    return;
  }
  if (facet->val != (xmlSchemaValPtr)0x0) {
    xmlSchemaFreeValue(facet->val);
  }
  if (facet->regexp != (xmlRegexpPtr)0x0) {
    xmlRegFreeRegexp(facet->regexp);
  }
  pxVar1 = facet->annot;
  if (pxVar1 != (xmlSchemaAnnotPtr)0x0) {
    p_Var2 = pxVar1->next;
    (*xmlFree)(pxVar1);
    while (p_Var2 != (_xmlSchemaAnnot *)0x0) {
      p_Var3 = p_Var2->next;
      (*xmlFree)(p_Var2);
      p_Var2 = p_Var3;
    }
  }
  (*xmlFree)(facet);
  return;
}

Assistant:

void
xmlSchemaFreeFacet(xmlSchemaFacetPtr facet)
{
    if (facet == NULL)
        return;
    if (facet->val != NULL)
        xmlSchemaFreeValue(facet->val);
    if (facet->regexp != NULL)
        xmlRegFreeRegexp(facet->regexp);
    if (facet->annot != NULL)
        xmlSchemaFreeAnnot(facet->annot);
    xmlFree(facet);
}